

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O2

void __thiscall QWizardPage::setTitle(QWizardPage *this,QString *title)

{
  long lVar1;
  QWizardPage *pQVar2;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  QString::operator=((QString *)(lVar1 + 0x260),(QString *)title);
  if (*(QWizard **)(lVar1 + 600) != (QWizard *)0x0) {
    pQVar2 = QWizard::currentPage(*(QWizard **)(lVar1 + 600));
    if (pQVar2 == this) {
      QWizardPrivate::updateLayout(*(QWizardPrivate **)(*(long *)(lVar1 + 600) + 8));
      return;
    }
  }
  return;
}

Assistant:

void QWizardPage::setTitle(const QString &title)
{
    Q_D(QWizardPage);
    d->title = title;
    if (d->wizard && d->wizard->currentPage() == this)
        d->wizard->d_func()->updateLayout();
}